

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O3

void __thiscall
StatsByIP::StatsByIP
          (StatsByIP *this,uint8_t *addr,size_t addr_len,bool has_do,bool has_edns,
          bool not_qname_mini,bool is_recursive_query)

{
  undefined3 in_register_00000009;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  size_t __n;
  
  this->_vptr_StatsByIP = (_func_int **)&PTR__StatsByIP_001ac580;
  this->HashNext = (StatsByIP *)0x0;
  this->count = 1;
  this->hash = 0;
  this->nb_do = CONCAT31(in_register_00000009,has_do);
  this->nb_edns = CONCAT31(in_register_00000081,has_edns);
  this->nb_not_qname_mini = CONCAT31(in_register_00000089,not_qname_mini);
  this->nb_recursive_queries = (uint)is_recursive_query;
  __n = 0x10;
  if (addr_len < 0x10) {
    __n = addr_len;
  }
  this->option_mask = 0;
  this->nb_tcp_443 = 0;
  this->nb_tcp_583 = 0;
  this->query_seen = false;
  this->response_seen = false;
  memcpy(this->addr,addr,__n);
  this->addr_len = __n;
  return;
}

Assistant:

StatsByIP::StatsByIP(const uint8_t* addr, size_t addr_len, bool has_do, bool has_edns,
    bool not_qname_mini, bool is_recursive_query) :
    HashNext(NULL),
    count(1),
    hash(0),
    nb_do((has_do) ? 1 : 0),
    nb_edns((has_edns) ? 1 : 0),
    nb_not_qname_mini((not_qname_mini) ? 1 : 0),
    nb_recursive_queries((is_recursive_query) ? 1 : 0),
    nb_tcp_443(0),
    nb_tcp_583(0),
    query_seen(false),
    response_seen(false),
    option_mask(0)
{
    if (addr_len > 16)
    {
        addr_len = 16;
    }

    memcpy(this->addr, addr, addr_len);
    this->addr_len = addr_len;
}